

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O0

bool google::protobuf::stringpiece_internal::operator==(StringPiece x,StringPiece y)

{
  int iVar1;
  size_type __n;
  size_type sVar2;
  const_pointer pcVar3;
  const_pointer pcVar4;
  bool local_41;
  size_type len;
  StringPiece y_local;
  StringPiece x_local;
  
  y_local.ptr_ = (char *)y.length_;
  len = (size_type)y.ptr_;
  y_local.length_ = (size_type)x.ptr_;
  __n = StringPiece::size((StringPiece *)&y_local.length_);
  sVar2 = StringPiece::size((StringPiece *)&len);
  if (__n == sVar2) {
    pcVar3 = StringPiece::data((StringPiece *)&y_local.length_);
    pcVar4 = StringPiece::data((StringPiece *)&len);
    local_41 = true;
    if ((pcVar3 != pcVar4) && (local_41 = true, __n != 0)) {
      pcVar3 = StringPiece::data((StringPiece *)&y_local.length_);
      pcVar4 = StringPiece::data((StringPiece *)&len);
      iVar1 = memcmp(pcVar3,pcVar4,__n);
      local_41 = iVar1 == 0;
    }
    x_local.length_._7_1_ = local_41;
  }
  else {
    x_local.length_._7_1_ = false;
  }
  return x_local.length_._7_1_;
}

Assistant:

inline bool operator==(StringPiece x, StringPiece y) {
  StringPiece::size_type len = x.size();
  if (len != y.size()) {
    return false;
  }

  return x.data() == y.data() || len <= 0 ||
      memcmp(x.data(), y.data(), static_cast<size_t>(len)) == 0;
}